

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Formatter::make_option_opts_abi_cxx11_(Formatter *this,Option *opt)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ostream *poVar5;
  string *psVar6;
  reference ppOVar7;
  ostream *poVar8;
  Option *in_RDX;
  string *in_RDI;
  Option *op_1;
  iterator __end3_1;
  iterator __begin3_1;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range3_1;
  Option *op;
  iterator __end3;
  iterator __begin3;
  set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *__range3;
  stringstream out;
  Option *in_stack_fffffffffffffa18;
  _Rb_tree_const_iterator<CLI::Option_*> *in_stack_fffffffffffffa20;
  string *in_stack_fffffffffffffa40;
  FormatterBase *in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffaac;
  string local_4f0 [32];
  Option *local_4d0;
  _Self local_4c8;
  _Self local_4c0;
  undefined1 local_4b8 [48];
  undefined1 *local_488;
  allocator local_479;
  string local_478 [32];
  string local_458 [80];
  string local_408 [32];
  Option *local_3e8;
  _Self local_3e0;
  _Self local_3d8;
  undefined1 local_3d0 [48];
  undefined1 *local_3a0;
  allocator local_391;
  string local_390 [32];
  string local_370 [80];
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [30];
  undefined1 in_stack_fffffffffffffd66;
  undefined1 in_stack_fffffffffffffd67;
  Option *in_stack_fffffffffffffd68;
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  Option *local_18;
  
  local_18 = in_RDX;
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  Option::get_option_text_abi_cxx11_(local_18);
  uVar4 = ::std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    poVar5 = ::std::operator<<(local_190," ");
    psVar6 = Option::get_option_text_abi_cxx11_(local_18);
    ::std::operator<<(poVar5,(string *)psVar6);
  }
  else {
    iVar3 = Option::get_type_size(local_18);
    if (iVar3 != 0) {
      Option::get_type_name_abi_cxx11_
                ((Option *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      bVar1 = ::std::__cxx11::string::empty();
      ::std::__cxx11::string::~string(local_1d0);
      if (((bVar1 ^ 0xff) & 1) != 0) {
        poVar5 = ::std::operator<<(local_190," ");
        Option::get_type_name_abi_cxx11_
                  ((Option *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        FormatterBase::get_label(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
        ::std::operator<<(poVar5,local_1f0);
        ::std::__cxx11::string::~string(local_1f0);
        ::std::__cxx11::string::~string(local_210);
      }
      Option::get_default_str_abi_cxx11_(in_stack_fffffffffffffa18);
      bVar1 = ::std::__cxx11::string::empty();
      ::std::__cxx11::string::~string(local_230);
      if (((bVar1 ^ 0xff) & 1) != 0) {
        poVar5 = ::std::operator<<(local_190," [");
        Option::get_default_str_abi_cxx11_(in_stack_fffffffffffffa18);
        poVar5 = ::std::operator<<(poVar5,local_250);
        ::std::operator<<(poVar5,"] ");
        ::std::__cxx11::string::~string(local_250);
      }
      iVar3 = Option::get_expected_max(local_18);
      if (iVar3 == 0x20000000) {
        ::std::operator<<(local_190," ...");
      }
      else {
        iVar3 = Option::get_expected_min(local_18);
        if (1 < iVar3) {
          poVar5 = ::std::operator<<(local_190," x ");
          iVar3 = Option::get_expected(local_18);
          ::std::ostream::operator<<(poVar5,iVar3);
        }
      }
      bVar2 = OptionBase<CLI::Option>::get_required(&local_18->super_OptionBase<CLI::Option>);
      if (bVar2) {
        poVar5 = ::std::operator<<(local_190," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_290,"REQUIRED",(allocator *)&stack0xfffffffffffffd6f);
        FormatterBase::get_label(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
        ::std::operator<<(poVar5,local_270);
        ::std::__cxx11::string::~string(local_270);
        ::std::__cxx11::string::~string(local_290);
        ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd6f);
      }
    }
    Option::get_envname_abi_cxx11_(in_stack_fffffffffffffa18);
    bVar1 = ::std::__cxx11::string::empty();
    ::std::__cxx11::string::~string(local_2b8);
    if (((bVar1 ^ 0xff) & 1) != 0) {
      poVar5 = ::std::operator<<(local_190," (");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_2f8,"Env",&local_2f9);
      FormatterBase::get_label(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
      poVar5 = ::std::operator<<(poVar5,local_2d8);
      poVar5 = ::std::operator<<(poVar5,":");
      Option::get_envname_abi_cxx11_(in_stack_fffffffffffffa18);
      poVar5 = ::std::operator<<(poVar5,local_320);
      ::std::operator<<(poVar5,")");
      ::std::__cxx11::string::~string(local_320);
      ::std::__cxx11::string::~string(local_2d8);
      ::std::__cxx11::string::~string(local_2f8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
    }
    Option::get_needs(in_stack_fffffffffffffa18);
    bVar2 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::empty
                      ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                        *)0x12f395);
    std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
              ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
               0x12f3a8);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      poVar5 = ::std::operator<<(local_190," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_390,"Needs",&local_391);
      FormatterBase::get_label(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
      in_stack_fffffffffffffa48 = (FormatterBase *)::std::operator<<(poVar5,local_370);
      ::std::operator<<((ostream *)in_stack_fffffffffffffa48,":");
      ::std::__cxx11::string::~string(local_370);
      ::std::__cxx11::string::~string(local_390);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_391);
      Option::get_needs(in_stack_fffffffffffffa18);
      local_3a0 = local_3d0;
      local_3d8._M_node =
           (_Base_ptr)
           std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::begin
                     ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                       *)in_stack_fffffffffffffa18);
      local_3e0._M_node =
           (_Base_ptr)
           std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                     ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                       *)in_stack_fffffffffffffa18);
      while (bVar2 = std::operator!=(&local_3d8,&local_3e0), bVar2) {
        ppOVar7 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*(in_stack_fffffffffffffa20);
        local_3e8 = *ppOVar7;
        in_stack_fffffffffffffa40 = (string *)::std::operator<<(local_190," ");
        Option::get_name_abi_cxx11_
                  (in_stack_fffffffffffffd68,(bool)in_stack_fffffffffffffd67,
                   (bool)in_stack_fffffffffffffd66);
        ::std::operator<<((ostream *)in_stack_fffffffffffffa40,local_408);
        ::std::__cxx11::string::~string(local_408);
        std::_Rb_tree_const_iterator<CLI::Option_*>::operator++(in_stack_fffffffffffffa20);
      }
      std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
                ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
                 0x12f4e6);
    }
    Option::get_excludes(in_stack_fffffffffffffa18);
    bVar2 = std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::empty
                      ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                        *)0x12f647);
    std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
              ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
               0x12f65a);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      poVar5 = ::std::operator<<(local_190," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_478,"Excludes",&local_479);
      FormatterBase::get_label(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
      poVar5 = ::std::operator<<(poVar5,local_458);
      ::std::operator<<(poVar5,":");
      ::std::__cxx11::string::~string(local_458);
      ::std::__cxx11::string::~string(local_478);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_479);
      Option::get_excludes(in_stack_fffffffffffffa18);
      local_488 = local_4b8;
      local_4c0._M_node =
           (_Base_ptr)
           std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::begin
                     ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                       *)in_stack_fffffffffffffa18);
      local_4c8._M_node =
           (_Base_ptr)
           std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::end
                     ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>
                       *)in_stack_fffffffffffffa18);
      while (bVar2 = std::operator!=(&local_4c0,&local_4c8), bVar2) {
        ppOVar7 = std::_Rb_tree_const_iterator<CLI::Option_*>::operator*
                            ((_Rb_tree_const_iterator<CLI::Option_*> *)poVar5);
        local_4d0 = *ppOVar7;
        poVar8 = ::std::operator<<(local_190," ");
        Option::get_name_abi_cxx11_
                  (in_stack_fffffffffffffd68,(bool)in_stack_fffffffffffffd67,
                   (bool)in_stack_fffffffffffffd66);
        ::std::operator<<(poVar8,local_4f0);
        ::std::__cxx11::string::~string(local_4f0);
        std::_Rb_tree_const_iterator<CLI::Option_*>::operator++
                  ((_Rb_tree_const_iterator<CLI::Option_*> *)poVar5);
      }
      std::set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_>::~set
                ((set<CLI::Option_*,_std::less<CLI::Option_*>,_std::allocator<CLI::Option_*>_> *)
                 0x12f798);
    }
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string Formatter::make_option_opts(const Option *opt) const {
    std::stringstream out;

    if(!opt->get_option_text().empty()) {
        out << " " << opt->get_option_text();
    } else {
        if(opt->get_type_size() != 0) {
            if(!opt->get_type_name().empty())
                out << " " << get_label(opt->get_type_name());
            if(!opt->get_default_str().empty())
                out << " [" << opt->get_default_str() << "] ";
            if(opt->get_expected_max() == detail::expected_max_vector_size)
                out << " ...";
            else if(opt->get_expected_min() > 1)
                out << " x " << opt->get_expected();

            if(opt->get_required())
                out << " " << get_label("REQUIRED");
        }
        if(!opt->get_envname().empty())
            out << " (" << get_label("Env") << ":" << opt->get_envname() << ")";
        if(!opt->get_needs().empty()) {
            out << " " << get_label("Needs") << ":";
            for(const Option *op : opt->get_needs())
                out << " " << op->get_name();
        }
        if(!opt->get_excludes().empty()) {
            out << " " << get_label("Excludes") << ":";
            for(const Option *op : opt->get_excludes())
                out << " " << op->get_name();
        }
    }
    return out.str();
}